

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O2

void mdiffwrite(memfile *mf,void *buf,uint bytes)

{
  char *__ptr;
  int iVar1;
  bool bVar2;
  size_t __size;
  
  iVar1 = mf->diffpos;
  __size = (size_t)mf->difflen;
  bVar2 = true;
  while ((uint)__size < iVar1 + bytes) {
    __size = __size + 0x1000;
    mf->difflen = (int)__size;
    bVar2 = false;
  }
  __ptr = mf->diffbuf;
  if (!bVar2) {
    __ptr = (char *)realloc(__ptr,__size);
    mf->diffbuf = __ptr;
    iVar1 = mf->diffpos;
  }
  memcpy(__ptr + iVar1,buf,(ulong)bytes);
  mf->diffpos = mf->diffpos + bytes;
  return;
}

Assistant:

static void mdiffwrite(struct memfile *mf, const void *buf, unsigned int bytes)
{
	boolean do_realloc = FALSE;
	while (mf->difflen < mf->diffpos + bytes) {
	    mf->difflen += 4096;
	    do_realloc = TRUE;
	}

	if (do_realloc)
	    mf->diffbuf = realloc(mf->diffbuf, mf->difflen);
	memcpy(&mf->diffbuf[mf->diffpos], buf, bytes);
	mf->diffpos += bytes;
}